

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMaterialSystem.cpp
# Opt level: O2

void __thiscall
MaterialSystemTest_testMaterialNameAccess_Test::TestBody
          (MaterialSystemTest_testMaterialNameAccess_Test *this)

{
  aiMaterial *paVar1;
  char *pcVar2;
  AssertHelper local_448;
  AssertionResult gtest_ar_1;
  AssertHelper local_430;
  aiMaterial *mat;
  int retValue;
  aiString name;
  
  paVar1 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(paVar1);
  gtest_ar_1.success_ = false;
  gtest_ar_1._1_7_ = 0;
  mat = paVar1;
  testing::internal::CmpHelperNE<decltype(nullptr),aiMaterial*>
            ((internal *)&name,"nullptr","mat",(void **)&gtest_ar_1,&mat);
  if ((char)name.length == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (name.data._4_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)name.data._4_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x87,pcVar2);
    testing::internal::AssertHelper::operator=(&local_448,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_448);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(name.data + 4));
  aiMaterial::GetName(&name,mat);
  retValue = strncmp(name.data,"DefaultMaterial",(ulong)name.length);
  local_448.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_1,"0","retValue",(int *)&local_448,&retValue);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_448);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_430,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x8b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_430,(Message *)&local_448);
    testing::internal::AssertHelper::~AssertHelper(&local_430);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_448);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  paVar1 = mat;
  if (mat != (aiMaterial *)0x0) {
    aiMaterial::~aiMaterial(mat);
  }
  operator_delete(paVar1);
  return;
}

Assistant:

TEST_F(MaterialSystemTest, testMaterialNameAccess) {
    aiMaterial *mat = new aiMaterial();
    EXPECT_NE(nullptr, mat);

    aiString name = mat->GetName();
    const int retValue(strncmp(name.C_Str(), AI_DEFAULT_MATERIAL_NAME, name.length));
    EXPECT_EQ(0, retValue );

    delete mat;
}